

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

void djgt__get_glpus(GLint *state)

{
  (*glad_glGetIntegerv)(0x88ef,state);
  (*glad_glGetIntegerv)(0xcf0,state + 1);
  (*glad_glGetIntegerv)(0xcf1,state + 2);
  (*glad_glGetIntegerv)(0xcf2,state + 3);
  (*glad_glGetIntegerv)(0x806e,state + 4);
  (*glad_glGetIntegerv)(0xcf3,state + 5);
  (*glad_glGetIntegerv)(0xcf4,state + 6);
  (*glad_glGetIntegerv)(0x806d,state + 7);
  (*glad_glGetIntegerv)(0xcf5,state + 8);
  return;
}

Assistant:

static void djgt__get_glpus(djgt__glpss state)
{
    glGetIntegerv(GL_PIXEL_UNPACK_BUFFER_BINDING, state    );
    glGetIntegerv(GL_UNPACK_SWAP_BYTES          , state + 1);
    glGetIntegerv(GL_UNPACK_LSB_FIRST           , state + 2);
    glGetIntegerv(GL_UNPACK_ROW_LENGTH          , state + 3);
    glGetIntegerv(GL_UNPACK_IMAGE_HEIGHT        , state + 4);
    glGetIntegerv(GL_UNPACK_SKIP_ROWS           , state + 5);
    glGetIntegerv(GL_UNPACK_SKIP_PIXELS         , state + 6);
    glGetIntegerv(GL_UNPACK_SKIP_IMAGES         , state + 7);
    glGetIntegerv(GL_UNPACK_ALIGNMENT           , state + 8);
}